

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ArenaImpl::~ArenaImpl(ArenaImpl *this)

{
  __pointer_type this_00;
  
  for (this_00 = (this->threads_)._M_b._M_p; this_00 != (SerialArena *)0x0; this_00 = this_00->next_
      ) {
    if (this_00->cleanup_ != (CleanupChunk *)0x0) {
      SerialArena::CleanupListFallback(this_00);
    }
  }
  FreeBlocks(this);
  return;
}

Assistant:

ArenaImpl::~ArenaImpl() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  FreeBlocks();
}